

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_suite.cpp
# Opt level: O0

void search_array(void)

{
  bool bVar1;
  size_type in_RCX;
  size_type sVar2;
  char *pcVar3;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_02;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_03;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_04;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_05;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_06;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_07;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_08;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_09;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_10;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_11;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_12;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_13;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_14;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_15;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1eb8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1e98;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1e78;
  basic_variable<std::allocator<char>_> *local_1e58;
  basic_variable<std::allocator<char>_> *local_1e38;
  basic_variable<std::allocator<char>_> *local_1e18;
  basic_variable<std::allocator<char>_> *local_1df8;
  basic_variable<std::allocator<char>_> *local_1dd8;
  basic_variable<std::allocator<char>_> *local_1db8;
  basic_variable<std::allocator<char>_> *local_1d98;
  basic_variable<std::allocator<char>_> *local_1d78;
  basic_variable<std::allocator<char>_> *local_1d58;
  basic_variable<std::allocator<char>_> *local_1d38;
  basic_variable<std::allocator<char>_> *local_1d18;
  basic_variable<std::allocator<char>_> *local_1cf8;
  basic_variable<std::allocator<char>_> *local_1cd8;
  basic_variable<std::allocator<char>_> *local_1c88;
  iterator local_1c80;
  iterator local_1c68;
  iterator local_1c50;
  iterator local_1c38;
  iterator local_1c20;
  undefined1 local_1c08 [8];
  iterator where_22;
  bool local_1be1;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1be0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1bd8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1b78;
  undefined1 local_1b18 [24];
  variable subsequence_22;
  iterator local_1ad0;
  iterator local_1ab8;
  difference_type local_1aa0 [2];
  iterator local_1a90;
  iterator local_1a78;
  iterator local_1a60;
  iterator local_1a48;
  undefined1 local_1a30 [8];
  iterator where_21;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1a08;
  undefined1 local_19a8 [24];
  variable subsequence_21;
  iterator local_1960;
  iterator local_1948;
  difference_type local_1930 [2];
  iterator local_1920;
  iterator local_1908;
  iterator local_18f0;
  iterator local_18d8;
  undefined1 local_18c0 [8];
  iterator where_20;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1898;
  undefined1 local_1838 [24];
  variable subsequence_20;
  iterator local_17f0;
  iterator local_17d8;
  iterator local_17c0;
  iterator local_17a8;
  iterator local_1790;
  undefined1 local_1778 [8];
  iterator where_19;
  basic_variable<std::allocator<char>_> local_1758;
  basic_variable<std::allocator<char>_> local_1728;
  basic_variable<std::allocator<char>_> local_16f8;
  undefined1 local_16c8 [24];
  variable subsequence_19;
  iterator local_1680;
  iterator local_1668;
  iterator local_1650;
  iterator local_1638;
  iterator local_1620;
  undefined1 local_1608 [8];
  iterator where_18;
  basic_variable<std::allocator<char>_> local_15e8;
  basic_variable<std::allocator<char>_> local_15b8;
  undefined1 local_1588 [24];
  variable subsequence_18;
  undefined4 local_153c;
  iterator local_1538;
  iterator local_1520;
  difference_type local_1508 [2];
  iterator local_14f8;
  iterator local_14e0;
  iterator local_14c8;
  iterator local_14b0;
  undefined1 local_1498 [8];
  iterator where_17;
  basic_variable<std::allocator<char>_> local_1478;
  undefined1 local_1448 [24];
  variable subsequence_17;
  undefined4 local_13fc;
  iterator local_13f8;
  iterator local_13e0;
  difference_type local_13c8 [2];
  iterator local_13b8;
  iterator local_13a0;
  iterator local_1388;
  iterator local_1370;
  undefined1 local_1358 [8];
  iterator where_16;
  basic_variable<std::allocator<char>_> local_1338;
  undefined1 local_1308 [24];
  variable subsequence_16;
  undefined4 local_12bc;
  iterator local_12b8;
  iterator local_12a0;
  difference_type local_1288 [2];
  iterator local_1278;
  iterator local_1260;
  iterator local_1248;
  iterator local_1230;
  undefined1 local_1218 [8];
  iterator where_15;
  basic_variable<std::allocator<char>_> local_11f8;
  undefined1 local_11c8 [24];
  variable subsequence_15;
  undefined4 local_117c;
  iterator local_1178;
  iterator local_1160;
  difference_type local_1148 [2];
  iterator local_1138;
  iterator local_1120;
  iterator local_1108;
  iterator local_10f0;
  undefined1 local_10d8 [8];
  iterator where_14;
  basic_variable<std::allocator<char>_> local_10b8;
  undefined1 local_1088 [24];
  variable subsequence_14;
  iterator local_1040;
  iterator local_1028;
  iterator local_1010;
  iterator local_ff8;
  iterator local_fe0;
  undefined1 local_fc8 [8];
  iterator where_13;
  basic_variable<std::allocator<char>_> local_fa8;
  undefined1 local_f78 [24];
  variable subsequence_13;
  undefined4 local_f2c;
  iterator local_f28;
  iterator local_f10;
  difference_type local_ef8 [2];
  iterator local_ee8;
  iterator local_ed0;
  iterator local_eb8;
  iterator local_ea0;
  undefined1 local_e88 [8];
  iterator where_12;
  basic_variable<std::allocator<char>_> local_e68;
  undefined1 local_e38 [24];
  variable subsequence_12;
  iterator local_df0;
  iterator local_dd8;
  iterator local_dc0;
  iterator local_da8;
  iterator local_d90;
  undefined1 local_d78 [8];
  iterator where_11;
  basic_variable<std::allocator<char>_> local_d58;
  undefined1 local_d28 [24];
  variable subsequence_11;
  undefined4 local_cdc;
  iterator local_cd8;
  iterator local_cc0;
  difference_type local_ca8 [2];
  iterator local_c98;
  iterator local_c80;
  iterator local_c68;
  iterator local_c50;
  undefined1 local_c38 [8];
  iterator where_10;
  basic_variable<std::allocator<char>_> local_c18;
  undefined1 local_be8 [24];
  variable subsequence_10;
  iterator local_ba0;
  iterator local_b88;
  iterator local_b70;
  iterator local_b58;
  iterator local_b40;
  undefined1 local_b28 [8];
  iterator where_9;
  basic_variable<std::allocator<char>_> local_b08;
  undefined1 local_ad8 [24];
  variable subsequence_9;
  undefined4 local_a8c;
  iterator local_a88;
  iterator local_a70;
  difference_type local_a58 [2];
  iterator local_a48;
  iterator local_a30;
  iterator local_a18;
  iterator local_a00;
  undefined1 local_9e8 [8];
  iterator where_8;
  basic_variable<std::allocator<char>_> local_9c8;
  undefined1 local_998 [24];
  variable subsequence_8;
  iterator local_950;
  iterator local_938;
  iterator local_920;
  iterator local_908;
  iterator local_8f0;
  undefined1 local_8d8 [8];
  iterator where_7;
  basic_variable<std::allocator<char>_> local_8b8;
  undefined1 local_888 [24];
  variable subsequence_7;
  iterator local_840;
  iterator local_828;
  difference_type local_810 [2];
  iterator local_800;
  iterator local_7e8;
  iterator local_7d0;
  iterator local_7b8;
  undefined1 local_7a0 [8];
  iterator where_6;
  variable subsequence_6;
  iterator local_750;
  iterator local_738;
  difference_type local_720 [2];
  iterator local_710;
  iterator local_6f8;
  iterator local_6e0;
  iterator local_6c8;
  undefined1 local_6b0 [8];
  iterator where_5;
  variable subsequence_5;
  iterator local_660;
  iterator local_648;
  difference_type local_630 [2];
  iterator local_620;
  iterator local_608;
  iterator local_5f0;
  iterator local_5d8;
  undefined1 local_5c0 [8];
  iterator where_4;
  variable subsequence_4;
  iterator local_570;
  iterator local_558;
  difference_type local_540 [2];
  iterator local_530;
  iterator local_518;
  iterator local_500;
  iterator local_4e8;
  undefined1 local_4d0 [8];
  iterator where_3;
  variable subsequence_3;
  iterator local_480;
  iterator local_468;
  difference_type local_450 [2];
  iterator local_440;
  iterator local_428;
  iterator local_410;
  iterator local_3f8;
  undefined1 local_3e0 [8];
  iterator where_2;
  variable subsequence_2;
  iterator local_390;
  iterator local_378;
  difference_type local_360 [2];
  iterator local_350;
  iterator local_338;
  iterator local_320;
  iterator local_308;
  undefined1 local_2f0 [8];
  iterator where_1;
  variable subsequence_1;
  iterator local_2a0;
  iterator local_288;
  difference_type local_270 [2];
  iterator local_260;
  iterator local_248;
  iterator local_230;
  iterator local_218;
  undefined1 local_200 [8];
  iterator where;
  variable subsequence;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_198,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_168,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_138,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_108,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a8,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,L"delta");
  local_48._0_8_ = &local_198;
  local_48._8_8_ = 7;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_1c88 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_1c88 = local_1c88 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1c88);
  } while (local_1c88 != &local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_218,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_230,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_248,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_260,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_200,&local_218,&local_230,&local_248,&local_260);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_260);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_248);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_230);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_288,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_2a0,(iterator *)local_200);
  local_270[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_288,&local_2a0);
  subsequence_1.storage._44_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x2c3,"void search_array()",local_270,&subsequence_1.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_288);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_200);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_308,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_320,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_338,
             (basic_variable<std::allocator<char>_> *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_350,
             (basic_variable<std::allocator<char>_> *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_2f0,&local_308,&local_320,&local_338,&local_350);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_350);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_338);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_320);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_308);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_378,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_390,(iterator *)local_2f0);
  local_360[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_378,&local_390);
  subsequence_2.storage._44_4_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x2ca,"void search_array()",local_360,&subsequence_2.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_390);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_378);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_2f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)
             &where_2.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3f8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_410,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_428,
             (basic_variable<std::allocator<char>_> *)
             &where_2.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_440,
             (basic_variable<std::allocator<char>_> *)
             &where_2.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_3e0,&local_3f8,&local_410,&local_428,&local_440);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_440);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_428);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_410);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_468,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_480,(iterator *)local_3e0);
  local_450[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_468,&local_480);
  subsequence_3.storage._44_4_ = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x2d1,"void search_array()",local_450,&subsequence_3.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_480);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_468);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_3e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_2.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_3.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_4e8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_500,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_518,
             (basic_variable<std::allocator<char>_> *)
             &where_3.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_530,
             (basic_variable<std::allocator<char>_> *)
             &where_3.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_4d0,&local_4e8,&local_500,&local_518,&local_530);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_530);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_518);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_500);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_558,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_570,(iterator *)local_4d0);
  local_540[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_558,&local_570);
  subsequence_4.storage._44_4_ = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x2d8,"void search_array()",local_540,&subsequence_4.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_570);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_558);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_4d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_3.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_4.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_5d8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_5f0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_608,
             (basic_variable<std::allocator<char>_> *)
             &where_4.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_620,
             (basic_variable<std::allocator<char>_> *)
             &where_4.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_5c0,&local_5d8,&local_5f0,&local_608,&local_620);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_620);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_608);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_648,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_660,(iterator *)local_5c0);
  local_630[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_648,&local_660);
  subsequence_5.storage._44_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x2df,"void search_array()",local_630,&subsequence_5.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_660);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_648);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_5c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_4.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_5.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_6c8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_6e0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_6f8,
             (basic_variable<std::allocator<char>_> *)
             &where_5.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_710,
             (basic_variable<std::allocator<char>_> *)
             &where_5.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_6b0,&local_6c8,&local_6e0,&local_6f8,&local_710);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_710);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_738,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_750,(iterator *)local_6b0);
  local_720[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_738,&local_750);
  subsequence_6.storage._44_4_ = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x2e6,"void search_array()",local_720,&subsequence_6.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_750);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_738);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_6b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_5.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_7b8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_7d0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_7e8,
             (basic_variable<std::allocator<char>_> *)
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_800,
             (basic_variable<std::allocator<char>_> *)
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_7a0,&local_7b8,&local_7d0,&local_7e8,&local_800);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_800);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_7e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_7d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_7b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_828,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_840,(iterator *)local_7a0);
  local_810[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_828,&local_840);
  subsequence_7.storage._44_4_ = 6;
  sVar2 = 0x2ed;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","6",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x2ed,"void search_array()",local_810,&subsequence_7.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_840);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_828);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_7a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  where_7.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_8b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)
             where_7.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,false);
  local_888._0_8_ = &local_8b8;
  local_888._8_8_ = 1;
  init_00._M_len = sVar2;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_888 + 0x10),
             (basic_array<std::allocator<char>_> *)local_888._0_8_,init_00);
  local_1cd8 = (basic_variable<std::allocator<char>_> *)local_888;
  do {
    local_1cd8 = local_1cd8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1cd8);
  } while (local_1cd8 != &local_8b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_8f0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_908,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_920,(basic_variable<std::allocator<char>_> *)(local_888 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_938,(basic_variable<std::allocator<char>_> *)(local_888 + 0x10));
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_8d8,&local_8f0,&local_908,&local_920,&local_938);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_938);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_920);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_908);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_950,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_8d8,&local_950);
  pcVar3 = "void search_array()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x2f4,"void search_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_950);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_8d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_888 + 0x10));
  where_8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_9c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)
             where_8.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,true);
  local_998._0_8_ = &local_9c8;
  local_998._8_8_ = 1;
  init_01._M_len = (size_type)pcVar3;
  init_01._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_998 + 0x10),
             (basic_array<std::allocator<char>_> *)local_998._0_8_,init_01);
  local_1cf8 = (basic_variable<std::allocator<char>_> *)local_998;
  do {
    local_1cf8 = local_1cf8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1cf8);
  } while (local_1cf8 != &local_9c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_a00,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_a18,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_a30,(basic_variable<std::allocator<char>_> *)(local_998 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_a48,(basic_variable<std::allocator<char>_> *)(local_998 + 0x10));
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_9e8,&local_a00,&local_a18,&local_a30,&local_a48);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a48);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a30);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a18);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a00);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_a70,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_a88,(iterator *)local_9e8);
  local_a58[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_a70,&local_a88);
  local_a8c = 0;
  sVar2 = 0x2fa;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x2fa,"void search_array()",local_a58,&local_a8c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a88);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a70);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_9e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_998 + 0x10));
  where_9.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_b08;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)
             where_9.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,0);
  local_ad8._0_8_ = &local_b08;
  local_ad8._8_8_ = 1;
  init_02._M_len = sVar2;
  init_02._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_ad8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_ad8._0_8_,init_02);
  local_1d18 = (basic_variable<std::allocator<char>_> *)local_ad8;
  do {
    local_1d18 = local_1d18 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1d18);
  } while (local_1d18 != &local_b08);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_b40,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_b58,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_b70,(basic_variable<std::allocator<char>_> *)(local_ad8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_b88,(basic_variable<std::allocator<char>_> *)(local_ad8 + 0x10));
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_b28,&local_b40,&local_b58,&local_b70,&local_b88);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_b88);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_b70);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_b58);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_b40);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_ba0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_b28,&local_ba0);
  pcVar3 = "void search_array()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x300,"void search_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_ba0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_b28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_ad8 + 0x10));
  where_10.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_c18;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)
             where_10.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,2);
  local_be8._0_8_ = &local_c18;
  local_be8._8_8_ = 1;
  init_03._M_len = (size_type)pcVar3;
  init_03._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_be8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_be8._0_8_,init_03);
  local_1d38 = (basic_variable<std::allocator<char>_> *)local_be8;
  do {
    local_1d38 = local_1d38 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1d38);
  } while (local_1d38 != &local_c18);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_c50,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_c68,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_c80,(basic_variable<std::allocator<char>_> *)(local_be8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_c98,(basic_variable<std::allocator<char>_> *)(local_be8 + 0x10));
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_c38,&local_c50,&local_c68,&local_c80,&local_c98);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c98);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c80);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c68);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c50);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_cc0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_cd8,(iterator *)local_c38);
  local_ca8[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_cc0,&local_cd8);
  local_cdc = 1;
  sVar2 = 0x306;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x306,"void search_array()",local_ca8,&local_cdc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_cd8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_cc0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_c38);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_be8 + 0x10));
  where_11.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_d58;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)
             where_11.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,0.0);
  local_d28._0_8_ = &local_d58;
  local_d28._8_8_ = 1;
  init_04._M_len = sVar2;
  init_04._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_d28 + 0x10),
             (basic_array<std::allocator<char>_> *)local_d28._0_8_,init_04);
  local_1d58 = (basic_variable<std::allocator<char>_> *)local_d28;
  do {
    local_1d58 = local_1d58 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1d58);
  } while (local_1d58 != &local_d58);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_d90,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_da8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_dc0,(basic_variable<std::allocator<char>_> *)(local_d28 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_dd8,(basic_variable<std::allocator<char>_> *)(local_d28 + 0x10));
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_d78,&local_d90,&local_da8,&local_dc0,&local_dd8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_dd8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_dc0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_da8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_d90);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_df0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_d78,&local_df0);
  pcVar3 = "void search_array()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x30c,"void search_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_df0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_d78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_d28 + 0x10));
  where_12.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_e68;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)
             where_12.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,3.0);
  local_e38._0_8_ = &local_e68;
  local_e38._8_8_ = 1;
  init_05._M_len = (size_type)pcVar3;
  init_05._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_e38 + 0x10),
             (basic_array<std::allocator<char>_> *)local_e38._0_8_,init_05);
  local_1d78 = (basic_variable<std::allocator<char>_> *)local_e38;
  do {
    local_1d78 = local_1d78 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1d78);
  } while (local_1d78 != &local_e68);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_ea0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_eb8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_ed0,(basic_variable<std::allocator<char>_> *)(local_e38 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_ee8,(basic_variable<std::allocator<char>_> *)(local_e38 + 0x10));
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_e88,&local_ea0,&local_eb8,&local_ed0,&local_ee8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_ee8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_ed0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_eb8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_ea0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_f10,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_f28,(iterator *)local_e88);
  local_ef8[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_f10,&local_f28);
  local_f2c = 2;
  sVar2 = 0x312;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x312,"void search_array()",local_ef8,&local_f2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_f28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_f10);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_e88);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_e38 + 0x10));
  where_13.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_fa8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             where_13.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,"");
  local_f78._0_8_ = &local_fa8;
  local_f78._8_8_ = 1;
  init_06._M_len = sVar2;
  init_06._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_f78 + 0x10),
             (basic_array<std::allocator<char>_> *)local_f78._0_8_,init_06);
  local_1d98 = (basic_variable<std::allocator<char>_> *)local_f78;
  do {
    local_1d98 = local_1d98 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1d98);
  } while (local_1d98 != &local_fa8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_fe0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_ff8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1010,(basic_variable<std::allocator<char>_> *)(local_f78 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1028,(basic_variable<std::allocator<char>_> *)(local_f78 + 0x10));
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_fc8,&local_fe0,&local_ff8,&local_1010,&local_1028);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1028);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1010);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_ff8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_fe0);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1040,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_fc8,&local_1040);
  pcVar3 = "void search_array()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x318,"void search_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1040);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_fc8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_f78 + 0x10));
  where_14.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_10b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             where_14.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,"alpha");
  local_1088._0_8_ = &local_10b8;
  local_1088._8_8_ = 1;
  init_07._M_len = (size_type)pcVar3;
  init_07._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1088 + 0x10),
             (basic_array<std::allocator<char>_> *)local_1088._0_8_,init_07);
  local_1db8 = (basic_variable<std::allocator<char>_> *)local_1088;
  do {
    local_1db8 = local_1db8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1db8);
  } while (local_1db8 != &local_10b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_10f0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1108,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1120,(basic_variable<std::allocator<char>_> *)(local_1088 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1138,(basic_variable<std::allocator<char>_> *)(local_1088 + 0x10));
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_10d8,&local_10f0,&local_1108,&local_1120,&local_1138);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1138);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1120);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1108);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_10f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1160,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_1178,(iterator *)local_10d8);
  local_1148[0] =
       std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                 (&local_1160,&local_1178);
  local_117c = 3;
  sVar2 = 0x31e;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x31e,"void search_array()",local_1148,&local_117c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1178);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1160);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_10d8)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1088 + 0x10));
  where_15.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_11f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             where_15.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,L"bravo");
  local_11c8._0_8_ = &local_11f8;
  local_11c8._8_8_ = 1;
  init_08._M_len = sVar2;
  init_08._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_11c8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_11c8._0_8_,init_08);
  local_1dd8 = (basic_variable<std::allocator<char>_> *)local_11c8;
  do {
    local_1dd8 = local_1dd8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1dd8);
  } while (local_1dd8 != &local_11f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1230,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1248,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1260,(basic_variable<std::allocator<char>_> *)(local_11c8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1278,(basic_variable<std::allocator<char>_> *)(local_11c8 + 0x10));
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_1218,&local_1230,&local_1248,&local_1260,&local_1278);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1278);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1260);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1248);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1230);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_12a0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_12b8,(iterator *)local_1218);
  local_1288[0] =
       std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                 (&local_12a0,&local_12b8);
  local_12bc = 4;
  sVar2 = 0x324;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x324,"void search_array()",local_1288,&local_12bc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_12b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_12a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_1218)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_11c8 + 0x10));
  where_16.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_1338;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             where_16.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,L"charlie");
  local_1308._0_8_ = &local_1338;
  local_1308._8_8_ = 1;
  init_09._M_len = sVar2;
  init_09._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1308 + 0x10),
             (basic_array<std::allocator<char>_> *)local_1308._0_8_,init_09);
  local_1df8 = (basic_variable<std::allocator<char>_> *)local_1308;
  do {
    local_1df8 = local_1df8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1df8);
  } while (local_1df8 != &local_1338);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1370,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1388,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_13a0,(basic_variable<std::allocator<char>_> *)(local_1308 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_13b8,(basic_variable<std::allocator<char>_> *)(local_1308 + 0x10));
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_1358,&local_1370,&local_1388,&local_13a0,&local_13b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_13b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_13a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1388);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1370);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_13e0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_13f8,(iterator *)local_1358);
  local_13c8[0] =
       std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                 (&local_13e0,&local_13f8);
  local_13fc = 5;
  sVar2 = 0x32a;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x32a,"void search_array()",local_13c8,&local_13fc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_13f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_13e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_1358)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1308 + 0x10));
  where_17.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_1478;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             where_17.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,L"delta");
  local_1448._0_8_ = &local_1478;
  local_1448._8_8_ = 1;
  init_10._M_len = sVar2;
  init_10._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1448 + 0x10),
             (basic_array<std::allocator<char>_> *)local_1448._0_8_,init_10);
  local_1e18 = (basic_variable<std::allocator<char>_> *)local_1448;
  do {
    local_1e18 = local_1e18 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1e18);
  } while (local_1e18 != &local_1478);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_14b0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_14c8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_14e0,(basic_variable<std::allocator<char>_> *)(local_1448 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_14f8,(basic_variable<std::allocator<char>_> *)(local_1448 + 0x10));
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_1498,&local_14b0,&local_14c8,&local_14e0,&local_14f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_14f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_14e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_14c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_14b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1520,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_1538,(iterator *)local_1498);
  local_1508[0] =
       std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                 (&local_1520,&local_1538);
  local_153c = 6;
  sVar2 = 0x330;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","6",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x330,"void search_array()",local_1508,&local_153c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1538);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1520);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_1498)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1448 + 0x10));
  where_18.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_15e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)
             where_18.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,true);
  where_18.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_15b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)
             where_18.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,3.0);
  local_1588._0_8_ = &local_15e8;
  local_1588._8_8_ = 2;
  init_11._M_len = sVar2;
  init_11._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1588 + 0x10),
             (basic_array<std::allocator<char>_> *)local_1588._0_8_,init_11);
  local_1e38 = (basic_variable<std::allocator<char>_> *)local_1588;
  do {
    local_1e38 = local_1e38 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1e38);
  } while (local_1e38 != &local_15e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1620,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1638,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1650,(basic_variable<std::allocator<char>_> *)(local_1588 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1668,(basic_variable<std::allocator<char>_> *)(local_1588 + 0x10));
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_1608,&local_1620,&local_1638,&local_1650,&local_1668);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1668);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1650);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1638);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1620);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1680,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_1608,&local_1680);
  pcVar3 = "void search_array()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x336,"void search_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1680);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_1608)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1588 + 0x10));
  where_19.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_1758;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)
             where_19.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,true);
  where_19.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_1728;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)
             where_19.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,2);
  where_19.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_16f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             where_19.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,"alpha");
  local_16c8._0_8_ = &local_1758;
  local_16c8._8_8_ = 3;
  init_12._M_len = (size_type)pcVar3;
  init_12._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_16c8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_16c8._0_8_,init_12);
  local_1e58 = (basic_variable<std::allocator<char>_> *)local_16c8;
  do {
    local_1e58 = local_1e58 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1e58);
  } while (local_1e58 != &local_1758);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1790,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_17a8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_17c0,(basic_variable<std::allocator<char>_> *)(local_16c8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_17d8,(basic_variable<std::allocator<char>_> *)(local_16c8 + 0x10));
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_1778,&local_1790,&local_17a8,&local_17c0,&local_17d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_17d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_17c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_17a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1790);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_17f0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_1778,&local_17f0);
  pcVar3 = "void search_array()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x33c,"void search_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_17f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_1778)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_16c8 + 0x10));
  where_20.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._15_1_ = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_bool,_true>
            (&local_1898,(char (*) [6])"alpha",
             (bool *)&where_20.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.field_0xf);
  local_1838._0_8_ = &local_1898;
  local_1838._8_8_ = 1;
  init_13._M_len = (size_type)pcVar3;
  init_13._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1838 + 0x10),
             (basic_map<std::allocator<char>_> *)local_1838._0_8_,init_13);
  local_1e78 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1838;
  do {
    local_1e78 = local_1e78 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1e78);
  } while (local_1e78 != &local_1898);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_18d8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_18f0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1908,(basic_variable<std::allocator<char>_> *)(local_1838 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1920,(basic_variable<std::allocator<char>_> *)(local_1838 + 0x10));
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_18c0,&local_18d8,&local_18f0,&local_1908,&local_1920);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1920);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1908);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_18f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_18d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1948,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_1960,(iterator *)local_18c0);
  local_1930[0] =
       std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                 (&local_1948,&local_1960);
  subsequence_21.storage._44_4_ = 0;
  sVar2 = 0x346;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x346,"void search_array()",local_1930,&subsequence_21.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1960);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1948);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_18c0)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1838 + 0x10));
  where_21.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 2;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            (&local_1a08,(char (*) [6])"bravo",
             (int *)&where_21.
                     super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                     .current.field_0xc);
  local_19a8._0_8_ = &local_1a08;
  local_19a8._8_8_ = 1;
  init_14._M_len = sVar2;
  init_14._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_19a8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_19a8._0_8_,init_14);
  local_1e98 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_19a8;
  do {
    local_1e98 = local_1e98 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1e98);
  } while (local_1e98 != &local_1a08);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1a48,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1a60,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1a78,(basic_variable<std::allocator<char>_> *)(local_19a8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1a90,(basic_variable<std::allocator<char>_> *)(local_19a8 + 0x10));
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_1a30,&local_1a48,&local_1a60,&local_1a78,&local_1a90);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1a90);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1a78);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1a60);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1a48);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1ab8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_1ad0,(iterator *)local_1a30);
  local_1aa0[0] =
       std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                 (&local_1ab8,&local_1ad0);
  subsequence_22.storage._44_4_ = 1;
  sVar2 = 0x34f;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x34f,"void search_array()",local_1aa0,&subsequence_22.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1ad0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1ab8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_1a30)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_19a8 + 0x10));
  local_1be0 = &local_1bd8;
  local_1be1 = true;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_bool,_true>(local_1be0,(char (*) [6])"alpha",&local_1be1);
  local_1be0 = &local_1b78;
  where_22.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current.current = '\0';
  where_22.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._9_7_ = 0x40080000000000;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_double,_true>
            (local_1be0,(char (*) [8])"charlie",
             (double *)
             &where_22.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_1b18._0_8_ = &local_1bd8;
  local_1b18._8_8_ = 2;
  init_15._M_len = sVar2;
  init_15._M_array = (iterator)0x2;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1b18 + 0x10),
             (basic_map<std::allocator<char>_> *)local_1b18._0_8_,init_15);
  local_1eb8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1b18;
  do {
    local_1eb8 = local_1eb8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1eb8);
  } while (local_1eb8 != &local_1bd8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1c20,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1c38,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1c50,(basic_variable<std::allocator<char>_> *)(local_1b18 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1c68,(basic_variable<std::allocator<char>_> *)(local_1b18 + 0x10));
  std::
  search<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_1c08,&local_1c20,&local_1c38,&local_1c50,&local_1c68);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1c68);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1c50);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1c38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1c20);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1c80,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_1c08,&local_1c80);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/search_suite.cpp"
             ,0x359,"void search_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1c80);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_1c08)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1b18 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void search_array()
{
    variable data = array::make({ true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
    // array - boolean
    {
        variable subsequence(true);
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
    }
    // array - integer
    {
        variable subsequence(2);
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
    }
    // array - real
    {
        variable subsequence(3.0);
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 2);
    }
    // array - string
    {
        variable subsequence("alpha");
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 3);
    }
    // array - wstring
    {
        variable subsequence(L"bravo");
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 4);
    }
    // array - u16string
    {
        variable subsequence(u"charlie");
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 5);
    }
    // array - u32string
    {
        variable subsequence(U"delta");
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 6);
    }
    // array - array
    {
        variable subsequence = array::make({ false });
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable subsequence = array::make({ true });
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
    }
    {
        variable subsequence = array::make({ 0 });
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable subsequence = array::make({ 2 });
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
    }
    {
        variable subsequence = array::make({ 0.0 });
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable subsequence = array::make({ 3.0 });
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 2);
    }
    {
        variable subsequence = array::make({ "" });
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable subsequence = array::make({ "alpha" });
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 3);
    }
    {
        variable subsequence = array::make({ L"bravo" });
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 4);
    }
    {
        variable subsequence = array::make({ u"charlie" });
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 5);
    }
    {
        variable subsequence = array::make({ U"delta" });
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 6);
    }
    {
        variable subsequence = array::make({ true, 3.0 });
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable subsequence = array::make({ true, 2, "alpha" });
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // array - map
    {
        variable subsequence = map::make(
            {
                { "alpha", true }
            });
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
    }
    {
        variable subsequence = map::make(
            {
                { "bravo", 2 }
            });
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
    }
    {
        variable subsequence = map::make(
            {
                { "alpha", true },
                { "charlie", 3.0 }
            });
        auto where = std::search(data.begin(), data.end(),
                                 subsequence.begin(), subsequence.end());
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
}